

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_globalz_set_table_gej
               (size_t len,secp256k1_ge *r,secp256k1_fe *globalz,secp256k1_gej *a,secp256k1_fe *zr)

{
  long lVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  secp256k1_ge *r_00;
  long lVar6;
  secp256k1_gej *a_00;
  secp256k1_fe *b;
  secp256k1_fe zs;
  secp256k1_fe local_58;
  
  lVar1 = len - 1;
  r_00 = r + (len - 2);
  r[len - 1].x.n[4] = a[lVar1].x.n[4];
  uVar3 = a[lVar1].x.n[0];
  uVar4 = a[lVar1].x.n[1];
  puVar2 = a[lVar1].x.n + 2;
  uVar5 = puVar2[1];
  r[len - 1].x.n[2] = *puVar2;
  r[len - 1].x.n[3] = uVar5;
  r[len - 1].x.n[0] = uVar3;
  r[len - 1].x.n[1] = uVar4;
  r[len - 1].y.n[4] = a[lVar1].y.n[4];
  uVar3 = a[lVar1].y.n[0];
  uVar4 = a[lVar1].y.n[1];
  puVar2 = a[lVar1].y.n + 2;
  uVar5 = puVar2[1];
  r[len - 1].y.n[2] = *puVar2;
  r[len - 1].y.n[3] = uVar5;
  r[len - 1].y.n[0] = uVar3;
  r[len - 1].y.n[1] = uVar4;
  uVar3 = a[lVar1].z.n[1];
  puVar2 = a[lVar1].z.n + 2;
  uVar4 = *puVar2;
  uVar5 = puVar2[1];
  globalz->n[0] = a[lVar1].z.n[0];
  globalz->n[1] = uVar3;
  globalz->n[2] = uVar4;
  globalz->n[3] = uVar5;
  globalz->n[4] = a[lVar1].z.n[4];
  r[len - 1].infinity = 0;
  b = zr + (len - 1);
  local_58.n[4] = zr[len - 1].n[4];
  local_58.n[0] = b->n[0];
  local_58.n[1] = zr[len - 1].n[1];
  local_58.n[2] = zr[len - 1].n[2];
  local_58.n[3] = zr[len - 1].n[3];
  a_00 = a + (len - 2);
  for (lVar6 = 0; lVar1 != lVar6; lVar6 = lVar6 + 1) {
    if (lVar6 != 0) {
      secp256k1_fe_mul(&local_58,&local_58,b);
    }
    secp256k1_ge_set_gej_zinv(r_00,a_00,&local_58);
    b = b + -1;
    a_00 = a_00 + -1;
    r_00 = r_00 + -1;
  }
  return;
}

Assistant:

static void secp256k1_ge_globalz_set_table_gej(size_t len, secp256k1_ge *r, secp256k1_fe *globalz, const secp256k1_gej *a, const secp256k1_fe *zr) {
    size_t i = len - 1;
    secp256k1_fe zs;

    if (len > 0) {
        /* The z of the final point gives us the "global Z" for the table. */
        r[i].x = a[i].x;
        r[i].y = a[i].y;
        *globalz = a[i].z;
        r[i].infinity = 0;
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &zs);
        }
    }
}